

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O3

bool NumberTemp::IsTempUse(Instr *instr,Sym *sym,BackwardPass *backwardPass)

{
  OpCode opcode;
  Opnd *this;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a;
  
  opcode = instr->m_opcode;
  bVar2 = OpCodeAttr::NonTempNumberSources(opcode);
  if (bVar2) {
LAB_006309fb:
    if (opcode == StElemI_A) {
      this = instr->m_dst;
      OVar3 = IR::Opnd::GetKind(this);
      if (OVar3 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      local_1a = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(this[1]._vptr_Opnd + 1);
      bVar2 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_1a.field_0);
      if (bVar2) goto LAB_00630a97;
    }
    bVar2 = false;
  }
  else {
    bVar2 = OpCodeAttr::TempNumberTransfer(opcode);
    if ((bVar2) && ((instr->field_0x36 & 2) == 0)) goto LAB_006309fb;
LAB_00630a97:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool
NumberTemp::IsTempUse(IR::Instr * instr, Sym * sym, BackwardPass * backwardPass)
{
    Js::OpCode opcode = instr->m_opcode;
    if (OpCodeAttr::NonTempNumberSources(opcode)
        || (OpCodeAttr::TempNumberTransfer(opcode) && !instr->dstIsTempNumber))
    {
        // For TypedArray stores, we don't store the Var object, so MarkTemp is valid
        if (opcode != Js::OpCode::StElemI_A
            || !instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyOptimizedTypedArray())
        {
            // Mark the symbol as non-tempable if the instruction doesn't allow temp sources,
            // or it is transferred to a non-temp dst
            return false;
        }
    }
    return true;
}